

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipEntry.hpp
# Opt level: O0

uint32_t Zippy::Impl::ZipEntry::GetNewIndex(uint32_t latestIndex)

{
  uint32_t latestIndex_local;
  undefined4 local_4;
  
  local_4 = latestIndex;
  if (latestIndex <= GetNewIndex::index) {
    local_4 = GetNewIndex::index + 1;
  }
  GetNewIndex::index = local_4;
  return local_4;
}

Assistant:

static uint32_t GetNewIndex(uint32_t latestIndex = 0) {

                // ===== Set up a static index counter (set to zero the first time the function is executed)
                static uint32_t index{0};

                // ===== If the input value is larger than the current index value, set the index equal to the input.
                if (latestIndex > index) {
                    index = latestIndex;
                    return index;
                }

                // ===== Increment the index and return the value.
                return ++index;
            }